

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger *nparams,
                          SQUnsignedInteger *nfreevars)

{
  SQObjectType SVar1;
  SQClosure *pSVar2;
  SQFunctionProto *pSVar3;
  SQNativeClosure *c;
  SQObjectPtr *pSVar4;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar4->super_SQObject)._type;
  pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
  if (SVar1 == OT_NATIVECLOSURE) {
    *nparams = (SQUnsignedInteger)pSVar2->_env;
    pSVar4 = pSVar2->_defaultparams;
  }
  else {
    if (SVar1 != OT_CLOSURE) {
      sq_throwerror(v,"the object is not a closure");
      return -1;
    }
    pSVar3 = pSVar2->_function;
    *nparams = pSVar3->_nparameters;
    pSVar4 = (SQObjectPtr *)pSVar3->_noutervalues;
  }
  *nfreevars = (SQUnsignedInteger)pSVar4;
  return 0;
}

Assistant:

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger *nparams,SQUnsignedInteger *nfreevars)
{
    SQObject o = stack_get(v, idx);
    if(type(o) == OT_CLOSURE) {
        SQClosure *c = _closure(o);
        SQFunctionProto *proto = c->_function;
        *nparams = (SQUnsignedInteger)proto->_nparameters;
        *nfreevars = (SQUnsignedInteger)proto->_noutervalues;
        return SQ_OK;
    }
    else if(type(o) == OT_NATIVECLOSURE)
    {
        SQNativeClosure *c = _nativeclosure(o);
        *nparams = (SQUnsignedInteger)c->_nparamscheck;
        *nfreevars = c->_noutervalues;
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}